

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

bool __thiscall despot::Variable::HasValue(Variable *this,string *value)

{
  pointer pbVar1;
  size_t __n;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  size_type *psVar7;
  
  pbVar1 = (this->values_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->values_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar5 == 0) {
    bVar4 = false;
  }
  else {
    uVar6 = lVar5 >> 5;
    __n = value->_M_string_length;
    psVar7 = &pbVar1->_M_string_length;
    bVar4 = true;
    uVar3 = 1;
    do {
      if (*psVar7 == __n) {
        if (__n == 0) {
          return bVar4;
        }
        iVar2 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar7 + -1))->_M_dataplus)._M_p,(value->_M_dataplus)._M_p,__n);
        if (iVar2 == 0) {
          return bVar4;
        }
      }
      bVar4 = uVar3 < uVar6;
      psVar7 = psVar7 + 4;
      lVar5 = uVar3 + (-(ulong)(uVar6 == 0) - uVar6);
      uVar3 = uVar3 + 1;
    } while (lVar5 != 0);
  }
  return bVar4;
}

Assistant:

const bool Variable::HasValue(string value) const {
	for (int i = 0; i < values_.size(); i++)
		if (values_[i] == value)
			return true;
	return false;
}